

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O0

int id3_fill_header(uchar *buf,uint len,unsigned_long id3_size)

{
  unsigned_long uVar1;
  uchar *ptr;
  unsigned_long id3_size_local;
  uint len_local;
  uchar *buf_local;
  
  if (buf == (uchar *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x5c,
                  "int id3_fill_header(unsigned char *, unsigned int, unsigned long)");
  }
  if (len != 0) {
    if (len < 10) {
      buf_local._4_4_ = 0;
    }
    else {
      buf[0] = 'I';
      buf[1] = 'D';
      buf[2] = '3';
      buf[3] = '\x02';
      buf[4] = '\0';
      buf[5] = '\0';
      uVar1 = id3_sync_safe(id3_size);
      buf[6] = (uchar)(uVar1 >> 0x18);
      uVar1 = id3_sync_safe(id3_size);
      buf[7] = (uchar)(uVar1 >> 0x10);
      uVar1 = id3_sync_safe(id3_size);
      buf[8] = (uchar)(uVar1 >> 8);
      uVar1 = id3_sync_safe(id3_size);
      buf[9] = (uchar)uVar1;
      buf_local._4_4_ = 10;
    }
    return buf_local._4_4_;
  }
  __assert_fail("len > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x5d
                ,"int id3_fill_header(unsigned char *, unsigned int, unsigned long)");
}

Assistant:

int id3_fill_header(unsigned char *buf, unsigned int len,
                    unsigned long id3_size) {
  assert(buf != NULL);
  assert(len > 0);
  if (len < 10)
    return 0;

  unsigned char *ptr = buf;
  memcpy(ptr, "ID3", 3); ptr += 3;
  UINT8_PACK(ptr, 0x02); UINT8_PACK(ptr, 0x00); /* version 2.0 */
  UINT8_PACK(ptr, 0x00);
  UINT32_PACK(ptr, id3_sync_safe(id3_size));
  return 10;
}